

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.cpp
# Opt level: O0

void __thiscall
enact::ParametricTypename::ParametricTypename
          (ParametricTypename *this,
          unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
          *constructorTypename,
          vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
          *parameterTypenames)

{
  bool bVar1;
  int iVar2;
  pointer pTVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  undefined4 extraout_var_00;
  string local_208 [32];
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *local_1e8;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *parameterTypename;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  *__range1;
  string separator;
  ostringstream local_198 [8];
  ostringstream name;
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  *parameterTypenames_local;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
  *constructorTypename_local;
  ParametricTypename *this_local;
  
  Typename::Typename(&this->super_Typename);
  (this->super_Typename)._vptr_Typename = (_func_int **)&PTR__ParametricTypename_0016a950;
  std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::unique_ptr
            (&this->m_constructorTypename,constructorTypename);
  std::
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  ::vector(&this->m_parameterTypenames,parameterTypenames);
  std::__cxx11::string::string((string *)&this->m_name);
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__cxx11::string::string((string *)&__range1);
  pTVar3 = std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::
           operator->(&this->m_constructorTypename);
  iVar2 = (*pTVar3->_vptr_Typename[4])();
  poVar4 = std::operator<<((ostream *)local_198,(string *)CONCAT44(extraout_var,iVar2));
  std::operator<<(poVar4,'[');
  __end1 = std::
           vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
           ::begin(&this->m_parameterTypenames);
  parameterTypename =
       (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
       std::
       vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
       ::end(&this->m_parameterTypenames);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_*,_std::vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>_>
                                *)&parameterTypename);
    if (!bVar1) break;
    local_1e8 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_*,_std::vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>_>
                ::operator*(&__end1);
    poVar4 = std::operator<<((ostream *)local_198,(string *)&__range1);
    pTVar3 = std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::
             operator->(local_1e8);
    iVar2 = (*pTVar3->_vptr_Typename[4])();
    std::operator<<(poVar4,(string *)CONCAT44(extraout_var_00,iVar2));
    std::__cxx11::string::operator=((string *)&__range1,", ");
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_*,_std::vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>_>
    ::operator++(&__end1);
  }
  std::operator<<((ostream *)local_198,']');
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)&this->m_name,local_208);
  std::__cxx11::string::~string(local_208);
  std::__cxx11::string::~string((string *)&__range1);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

ParametricTypename::ParametricTypename(
            std::unique_ptr<const Typename> constructorTypename,
            std::vector<std::unique_ptr<const Typename> > parameterTypenames) :
            m_constructorTypename{std::move(constructorTypename)},
            m_parameterTypenames{std::move(parameterTypenames)},
            m_name{} {
        std::ostringstream name;
        std::string separator;

        name << m_constructorTypename->name() << '[';
        for (const auto& parameterTypename : m_parameterTypenames) {
            name << separator << parameterTypename->name();
            separator = ", ";
        }
        name << ']';

        m_name = name.str();
    }